

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.h
# Opt level: O1

void __thiscall CsvModelSerialiser::~CsvModelSerialiser(CsvModelSerialiser *this)

{
  AbstractSingleRoleSerialiser::~AbstractSingleRoleSerialiser
            (&this->super_AbstractSingleRoleSerialiser);
  operator_delete(this,0x18);
  return;
}

Assistant:

class MODELUTILITIES_EXPORT CsvModelSerialiser : public AbstractSingleRoleSerialiser
{
    Q_OBJECT
    Q_PROPERTY(QString csvSeparator READ csvSeparator WRITE setCsvSeparator)
    Q_PROPERTY(bool firstRowIsHeader READ firstRowIsHeader WRITE setFirstRowIsHeader)
    Q_PROPERTY(bool firstColumnIsHeader READ firstColumnIsHeader WRITE setFirstColumnIsHeader)
    Q_DECLARE_PRIVATE(CsvModelSerialiser)
    Q_DISABLE_COPY(CsvModelSerialiser)
public:
    explicit CsvModelSerialiser(QObject *parent = Q_NULLPTR);
    CsvModelSerialiser(QAbstractItemModel *model, QObject *parent);
    CsvModelSerialiser(const QAbstractItemModel *model, QObject *parent);
    const QString &csvSeparator() const;
    void setCsvSeparator(const QString &val);
    bool firstRowIsHeader();
    bool firstColumnIsHeader();
    void setFirstRowIsHeader(bool val);
    void setFirstColumnIsHeader(bool val);
    virtual bool saveModel(QTextStream &stream) const;
    bool saveModel(QIODevice *destination) const Q_DECL_OVERRIDE;
    bool saveModel(QByteArray *destination) const Q_DECL_OVERRIDE;
    bool saveModel(QString *destination) const Q_DECL_OVERRIDE;
    bool loadModel(QString *source) Q_DECL_OVERRIDE;
    bool loadModel(QIODevice *source) Q_DECL_OVERRIDE;
    bool loadModel(const QByteArray &source) Q_DECL_OVERRIDE;
    virtual bool loadModel(QTextStream &stream);

protected:
    CsvModelSerialiser(CsvModelSerialiserPrivate &d, QObject *parent);

#ifdef MS_DECLARE_STREAM_OPERATORS
    friend QTextStream &operator<<(QTextStream &stream, const QAbstractItemModel &model);
    friend QTextStream &operator>>(QTextStream &stream, QAbstractItemModel &model);
#endif
}